

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SparseNode::SerializeWithCachedSizes
          (SparseNode *this,CodedOutputStream *output)

{
  char *pcVar1;
  int in_EDX;
  int __c;
  CodedOutputStream *__s;
  double dVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SparseNode *this_local;
  
  __s = output;
  pcVar1 = index(this,(char *)output,in_EDX);
  if ((int)pcVar1 != 0) {
    pcVar1 = index(this,(char *)__s,__c);
    google::protobuf::internal::WireFormatLite::WriteInt32(1,(int32)pcVar1,output);
  }
  dVar2 = value(this);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar2 = value(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(2,dVar2,output);
  }
  return;
}

Assistant:

void SparseNode::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SparseNode)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int32 index = 1;
  if (this->index() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->index(), output);
  }

  // double value = 2;
  if (this->value() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(2, this->value(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SparseNode)
}